

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<86UL> * __thiscall
mserialize::cx_strcat<1ul,1ul,30ul,1ul,6ul,3ul,6ul,4ul,10ul,16ul,7ul,1ul>
          (cx_string<86UL> *__return_storage_ptr__,mserialize *this,cx_string<1UL> *strings,
          cx_string<1UL> *strings_1,cx_string<30UL> *strings_2,cx_string<1UL> *strings_3,
          cx_string<6UL> *strings_4,cx_string<3UL> *strings_5,cx_string<6UL> *strings_6,
          cx_string<4UL> *strings_7,cx_string<10UL> *strings_8,cx_string<16UL> *strings_9,
          cx_string<7UL> *strings_10,cx_string<1UL> *strings_11)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  ulong auStack_148 [14];
  long lStack_d8;
  mserialize *local_d0;
  cx_string<1UL> *local_c8;
  cx_string<1UL> *local_c0;
  cx_string<30UL> *local_b8;
  cx_string<1UL> *local_b0;
  cx_string<6UL> *local_a8;
  cx_string<3UL> *pcStack_a0;
  cx_string<6UL> *local_98;
  cx_string<4UL> *pcStack_90;
  cx_string<10UL> *local_88;
  cx_string<16UL> *pcStack_80;
  cx_string<7UL> *local_78;
  char buffer [87];
  
  pcVar1 = buffer;
  buffer[0x40] = '\0';
  buffer[0x41] = '\0';
  buffer[0x42] = '\0';
  buffer[0x43] = '\0';
  buffer[0x44] = '\0';
  buffer[0x45] = '\0';
  buffer[0x46] = '\0';
  buffer[0x47] = '\0';
  buffer[0x48] = '\0';
  buffer[0x49] = '\0';
  buffer[0x4a] = '\0';
  buffer[0x4b] = '\0';
  buffer[0x4c] = '\0';
  buffer[0x4d] = '\0';
  buffer[0x4e] = '\0';
  buffer[0x30] = '\0';
  buffer[0x31] = '\0';
  buffer[0x32] = '\0';
  buffer[0x33] = '\0';
  buffer[0x34] = '\0';
  buffer[0x35] = '\0';
  buffer[0x36] = '\0';
  buffer[0x37] = '\0';
  buffer[0x38] = '\0';
  buffer[0x39] = '\0';
  buffer[0x3a] = '\0';
  buffer[0x3b] = '\0';
  buffer[0x3c] = '\0';
  buffer[0x3d] = '\0';
  buffer[0x3e] = '\0';
  buffer[0x3f] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  buffer[0x28] = '\0';
  buffer[0x29] = '\0';
  buffer[0x2a] = '\0';
  buffer[0x2b] = '\0';
  buffer[0x2c] = '\0';
  buffer[0x2d] = '\0';
  buffer[0x2e] = '\0';
  buffer[0x2f] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0x4f] = '\0';
  buffer[0x50] = '\0';
  buffer[0x51] = '\0';
  buffer[0x52] = '\0';
  buffer[0x53] = '\0';
  buffer[0x54] = '\0';
  buffer[0x55] = '\0';
  buffer[0x56] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  local_d0 = this;
  local_c8 = strings;
  local_c0 = strings_1;
  local_b8 = strings_2;
  local_b0 = strings_3;
  local_a8 = strings_4;
  pcStack_a0 = strings_5;
  local_98 = strings_6;
  pcStack_90 = strings_7;
  local_88 = strings_8;
  pcStack_80 = strings_9;
  local_78 = strings_10;
  auStack_148[1] = 1;
  auStack_148[2] = 1;
  auStack_148[3] = 0x1e;
  auStack_148[4] = 1;
  auStack_148[5] = 6;
  auStack_148[6] = 3;
  auStack_148[7] = 6;
  auStack_148[8] = 4;
  auStack_148[9] = 10;
  auStack_148[10] = 0x10;
  auStack_148[0xb] = 7;
  auStack_148[0xc] = 1;
  for (lVar2 = 1; lVar2 != 0xd; lVar2 = lVar2 + 1) {
    for (uVar3 = 0; uVar3 < auStack_148[lVar2]; uVar3 = uVar3 + 1) {
      pcVar1[uVar3] = *(char *)((&lStack_d8)[lVar2] + uVar3);
    }
    pcVar1 = pcVar1 + uVar3;
  }
  cx_string<86UL>::cx_string(__return_storage_ptr__,buffer);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}